

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O3

void __thiscall KDReports::ImageElement::ImageElement(ImageElement *this,QImage *image)

{
  ImageElementPrivate *pIVar1;
  pointer *__ptr;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ImageElement_00173328;
  pIVar1 = (ImageElementPrivate *)operator_new(0x58);
  *(undefined8 *)&(pIVar1->m_pixmap).d = 0;
  *(undefined8 *)((long)&(pIVar1->m_pixmap).d + 8) = 0;
  *(undefined8 *)((long)&(pIVar1->m_pixmap).d + 0x10) = 0;
  *(undefined8 *)((long)&(pIVar1->m_pixmap).d + 0x18) = 2;
  (pIVar1->m_pixmapSize).wd = -1;
  (pIVar1->m_pixmapSize).ht = -1;
  pIVar1->m_width = 0.0;
  pIVar1->m_height = 0.0;
  pIVar1->m_fitToPage = false;
  *(undefined8 *)&pIVar1->m_unit = 0;
  *(undefined8 *)((long)&(pIVar1->m_id).d + 4) = 0;
  *(char16_t **)((long)&(pIVar1->m_id).d + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(pIVar1->m_id).d + 0x10) = 0;
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
  .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl = pIVar1;
  setImage(this,image);
  return;
}

Assistant:

KDReports::ImageElement::ImageElement(const QImage &image)
    : d(new ImageElementPrivate)
{
    setImage(image);
}